

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

void char_to_room(CHAR_DATA *ch,ROOM_INDEX_DATA *pRoomIndex)

{
  short *psVar1;
  byte *pbVar2;
  AREA_DATA_conflict *pAVar3;
  bool bVar4;
  AFFECT_DATA *pAVar5;
  OBJ_DATA *obj;
  string_view fmt;
  
  while (pRoomIndex == (ROOM_INDEX_DATA *)0x0) {
    fmt._M_str = "Char_to_room: nullptr.";
    fmt._M_len = 0x16;
    CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt);
    pRoomIndex = get_room_index(0);
    if (pRoomIndex == (ROOM_INDEX_DATA *)0x0) {
      return;
    }
  }
  ch->in_room = pRoomIndex;
  ch->next_in_room = pRoomIndex->people;
  pRoomIndex->people = ch;
  bVar4 = is_npc(ch);
  if (bVar4) {
    if (ch->home_room == (ROOM_INDEX_DATA *)0x0) {
      ch->home_room = pRoomIndex;
    }
  }
  else {
    pAVar3 = ch->in_room->area;
    if (pAVar3->empty == true) {
      pAVar3->empty = false;
    }
    pAVar3->nplayer = pAVar3->nplayer + 1;
  }
  for (obj = ch->carrying; obj != (OBJ_DATA *)0x0; obj = obj->next_content) {
    if ((obj->wear_loc != -1) &&
       (((obj->item_type == 1 || (bVar4 = is_obj_stat(obj,0), bVar4)) &&
        (ch->in_room != (ROOM_INDEX_DATA *)0x0)))) {
      psVar1 = &ch->in_room->light;
      *psVar1 = *psVar1 + 3;
    }
  }
  if ((ch->progtypes[0] & 0x200) != 0) {
    ch->in_room->move_progs = true;
  }
  bVar4 = is_affected_by(ch,0x17);
  if (bVar4) {
    pAVar5 = (AFFECT_DATA *)&ch->affected;
    do {
      pAVar5 = pAVar5->next;
      if (pAVar5 == (AFFECT_DATA *)0x0) {
        pbVar2 = (byte *)((long)ch->affected_by + 2);
        *pbVar2 = *pbVar2 & 0x7f;
        return;
      }
    } while (pAVar5->tick_fun != plague_tick);
  }
  bVar4 = IS_ZERO_VECTOR(ch->in_room->affected_by);
  if (((!bVar4) || (ch->in_room->has_rune == true)) && (bVar4 = is_immortal(ch), bVar4)) {
    do_raffects(ch,"");
    return;
  }
  return;
}

Assistant:

void char_to_room(CHAR_DATA *ch, ROOM_INDEX_DATA *pRoomIndex)
{
	OBJ_DATA *obj;

	if (pRoomIndex == nullptr)
	{
		ROOM_INDEX_DATA *room;

		RS.Logger.Debug("Char_to_room: nullptr.");

		if ((room = get_room_index(ROOM_VNUM_TEMPLE)) != nullptr)
			char_to_room(ch, room);

		return;
	}

	ch->in_room = pRoomIndex;
	ch->next_in_room = pRoomIndex->people;
	pRoomIndex->people = ch;

	if (!is_npc(ch))
	{
		/* this is crashing us */
		if (ch->in_room->area->empty)
			ch->in_room->area->empty= false;

		++ch->in_room->area->nplayer;
	}
	else
	{
		if (ch->home_room == nullptr)
			ch->home_room = pRoomIndex;
	}

	for (obj = ch->carrying; obj; obj = obj->next_content)
	{
		if (obj->wear_loc != WEAR_NONE)
		{
			if ((obj->item_type == ITEM_LIGHT || is_obj_stat(obj, ITEM_GLOW)) && ch->in_room)
				ch->in_room->light += 3;
		}
	}

	if (IS_SET(ch->progtypes, MPROG_MOVE))
		ch->in_room->move_progs = true;

	if (is_affected_by(ch, AFF_PLAGUE))
	{
		AFFECT_DATA *af;

		for (af = ch->affected; af; af = af->next)
		{
			if (af->tick_fun == plague_tick)
			{
				break;
			}
		}

		if (!af)
		{
			REMOVE_BIT(ch->affected_by, AFF_PLAGUE);
			return;
		}
	}

	if ((!IS_ZERO_VECTOR(ch->in_room->affected_by) || ch->in_room->has_rune) && is_immortal(ch))
		do_raffects(ch, "");
}